

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

QMetaMethod QMetaMethod::fromSignalImpl(QMetaObject *metaObject,void **signal)

{
  StaticMetacallFunction p_Var1;
  uint *puVar2;
  Data DVar3;
  long in_FS_OFFSET;
  QMetaMethod QVar4;
  int i;
  uint local_3c;
  uint *local_38;
  void **local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &local_3c;
  local_3c = 0xffffffff;
  local_30 = signal;
  if (metaObject == (QMetaObject *)0x0) {
    metaObject = (QMetaObject *)0x0;
    DVar3.d = (uint *)0x0;
  }
  else {
    DVar3.d = (uint *)0x0;
    do {
      p_Var1 = (metaObject->d).static_metacall;
      if (p_Var1 != (StaticMetacallFunction)0x0) {
        (*p_Var1)((QObject *)0x0,IndexOfMethod,0,&local_38);
        if (-1 < (int)local_3c) {
          puVar2 = (metaObject->d).data;
          DVar3.d = puVar2 + (long)(int)puVar2[5] + (ulong)local_3c * 6;
          goto LAB_002822fe;
        }
      }
      metaObject = (metaObject->d).superdata.direct;
    } while (metaObject != (QMetaObject *)0x0);
    metaObject = (QMetaObject *)0x0;
  }
LAB_002822fe:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QVar4.data.d = DVar3.d;
    QVar4.mobj = metaObject;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethod QMetaMethod::fromSignalImpl(const QMetaObject *metaObject, void **signal)
{
    int i = -1;
    void *args[] = { &i, signal };
    for (const QMetaObject *m = metaObject; m; m = m->d.superdata) {
        m->static_metacall(QMetaObject::IndexOfMethod, 0, args);
        if (i >= 0)
            return QMetaMethod::fromRelativeMethodIndex(m, i);
    }
    return QMetaMethod();
}